

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclLibScl.c
# Opt level: O1

SC_Lib * Abc_SclReadFromGenlib(void *pLib0)

{
  uint uVar1;
  uint uVar2;
  double dVar3;
  int iVar4;
  Mio_PinPhase_t MVar5;
  SC_Lib *p;
  char *pcVar6;
  size_t sVar7;
  char *pcVar8;
  Mio_Gate_t *pGate;
  undefined8 *puVar9;
  void **ppvVar10;
  Mio_Pin_t *pMVar11;
  undefined8 *puVar12;
  void *pvVar13;
  word *pwVar14;
  undefined8 *puVar15;
  void *pvVar16;
  Vec_Wrd_t *p_00;
  int iVar17;
  long lVar18;
  
  p = (SC_Lib *)calloc(1,0x90);
  p->default_max_out_slew = -1.0;
  p->unit_time = 9;
  p->unit_cap_fst = 1.0;
  p->unit_cap_snd = 0xc;
  pcVar6 = Mio_LibraryReadName((Mio_Library_t *)pLib0);
  if (pcVar6 == (char *)0x0) {
    pcVar8 = (char *)0x0;
  }
  else {
    sVar7 = strlen(pcVar6);
    pcVar8 = (char *)malloc(sVar7 + 1);
    strcpy(pcVar8,pcVar6);
  }
  p->pName = pcVar8;
  p->default_wire_load = (char *)0x0;
  p->default_wire_load_sel = (char *)0x0;
  p->default_max_out_slew = 0.0;
  p->unit_time = 0xc;
  p->unit_cap_fst = 1.0;
  p->unit_cap_snd = 0xf;
  pGate = Mio_LibraryReadGates((Mio_Library_t *)pLib0);
  do {
    if (pGate == (Mio_Gate_t *)0x0) {
      Abc_SclHashCells(p);
      Abc_SclLinkCells(p);
      return p;
    }
    puVar9 = (undefined8 *)calloc(1,0x70);
    uVar1 = (p->vCells).nSize;
    *(uint *)(puVar9 + 1) = uVar1;
    uVar2 = (p->vCells).nCap;
    if (uVar1 == uVar2) {
      if ((int)uVar2 < 0x10) {
        ppvVar10 = (p->vCells).pArray;
        if (ppvVar10 == (void **)0x0) {
          ppvVar10 = (void **)malloc(0x80);
        }
        else {
          ppvVar10 = (void **)realloc(ppvVar10,0x80);
        }
        iVar4 = 0x10;
      }
      else {
        iVar4 = uVar2 * 2;
        if (iVar4 <= (int)uVar2) goto LAB_004691b1;
        ppvVar10 = (p->vCells).pArray;
        if (ppvVar10 == (void **)0x0) {
          ppvVar10 = (void **)malloc((ulong)uVar2 << 4);
        }
        else {
          ppvVar10 = (void **)realloc(ppvVar10,(ulong)uVar2 << 4);
        }
      }
      (p->vCells).pArray = ppvVar10;
      (p->vCells).nCap = iVar4;
    }
LAB_004691b1:
    iVar4 = (p->vCells).nSize;
    (p->vCells).nSize = iVar4 + 1;
    (p->vCells).pArray[iVar4] = puVar9;
    pcVar6 = Mio_GateReadName(pGate);
    if (pcVar6 == (char *)0x0) {
      pcVar8 = (char *)0x0;
    }
    else {
      sVar7 = strlen(pcVar6);
      pcVar8 = (char *)malloc(sVar7 + 1);
      strcpy(pcVar8,pcVar6);
    }
    *puVar9 = pcVar8;
    dVar3 = Mio_GateReadArea(pGate);
    *(float *)(puVar9 + 3) = (float)dVar3;
    *(undefined4 *)((long)puVar9 + 0x1c) = 0;
    *(undefined4 *)(puVar9 + 5) = 0;
    iVar4 = Mio_GateReadPinNum(pGate);
    *(int *)(puVar9 + 8) = iVar4;
    *(undefined4 *)((long)puVar9 + 0x44) = 1;
    *(int *)(puVar9 + 4) = (int)(*(float *)(puVar9 + 3) * 1000.0);
    *(int *)((long)puVar9 + 0x24) = (int)(*(float *)((long)puVar9 + 0x1c) * 1000.0);
    for (pMVar11 = Mio_GateReadPins(pGate); pMVar11 != (Mio_Pin_t *)0x0;
        pMVar11 = Mio_PinReadNext(pMVar11)) {
      puVar12 = (undefined8 *)calloc(1,0x50);
      *(undefined4 *)((long)puVar12 + 0x24) = 0xbf800000;
      uVar1 = *(uint *)(puVar9 + 6);
      if (*(uint *)((long)puVar9 + 0x34) == uVar1) {
        if ((int)uVar1 < 0x10) {
          if ((void *)puVar9[7] == (void *)0x0) {
            pvVar13 = malloc(0x80);
          }
          else {
            pvVar13 = realloc((void *)puVar9[7],0x80);
          }
          iVar4 = 0x10;
        }
        else {
          iVar4 = uVar1 * 2;
          if (iVar4 <= (int)uVar1) goto LAB_004692e2;
          if ((void *)puVar9[7] == (void *)0x0) {
            pvVar13 = malloc((ulong)uVar1 << 4);
          }
          else {
            pvVar13 = realloc((void *)puVar9[7],(ulong)uVar1 << 4);
          }
        }
        puVar9[7] = pvVar13;
        *(int *)(puVar9 + 6) = iVar4;
      }
LAB_004692e2:
      iVar4 = *(int *)((long)puVar9 + 0x34);
      *(int *)((long)puVar9 + 0x34) = iVar4 + 1;
      *(undefined8 **)(puVar9[7] + (long)iVar4 * 8) = puVar12;
      *(undefined4 *)(puVar12 + 1) = 1;
      pcVar6 = Mio_PinReadName(pMVar11);
      if (pcVar6 == (char *)0x0) {
        pcVar8 = (char *)0x0;
      }
      else {
        sVar7 = strlen(pcVar6);
        pcVar8 = (char *)malloc(sVar7 + 1);
        strcpy(pcVar8,pcVar6);
      }
      *puVar12 = pcVar8;
      puVar12[2] = 0;
      puVar12[3] = 0;
    }
    if (0 < *(int *)((long)puVar9 + 0x44)) {
      iVar4 = 0;
      do {
        pwVar14 = Mio_GateReadTruthP(pGate);
        puVar12 = (undefined8 *)calloc(1,0x50);
        *(undefined4 *)((long)puVar12 + 0x24) = 0xbf800000;
        uVar1 = *(uint *)(puVar9 + 6);
        if (*(uint *)((long)puVar9 + 0x34) == uVar1) {
          if ((int)uVar1 < 0x10) {
            if ((void *)puVar9[7] == (void *)0x0) {
              pvVar13 = malloc(0x80);
            }
            else {
              pvVar13 = realloc((void *)puVar9[7],0x80);
            }
            iVar17 = 0x10;
          }
          else {
            iVar17 = uVar1 * 2;
            if (iVar17 <= (int)uVar1) goto LAB_004693ef;
            if ((void *)puVar9[7] == (void *)0x0) {
              pvVar13 = malloc((ulong)uVar1 << 4);
            }
            else {
              pvVar13 = realloc((void *)puVar9[7],(ulong)uVar1 << 4);
            }
          }
          puVar9[7] = pvVar13;
          *(int *)(puVar9 + 6) = iVar17;
        }
LAB_004693ef:
        iVar17 = *(int *)((long)puVar9 + 0x34);
        *(int *)((long)puVar9 + 0x34) = iVar17 + 1;
        *(undefined8 **)(puVar9[7] + (long)iVar17 * 8) = puVar12;
        *(undefined4 *)(puVar12 + 1) = 2;
        pcVar6 = Mio_GateReadOutName(pGate);
        if (pcVar6 == (char *)0x0) {
          pcVar8 = (char *)0x0;
        }
        else {
          sVar7 = strlen(pcVar6);
          pcVar8 = (char *)malloc(sVar7 + 1);
          strcpy(pcVar8,pcVar6);
        }
        *puVar12 = pcVar8;
        puVar12[4] = 0;
        pcVar6 = Mio_GateReadForm(pGate);
        if (pcVar6 == (char *)0x0) {
          pcVar8 = (char *)0x0;
        }
        else {
          sVar7 = strlen(pcVar6);
          pcVar8 = (char *)malloc(sVar7 + 1);
          strcpy(pcVar8,pcVar6);
        }
        puVar12[5] = pcVar8;
        p_00 = (Vec_Wrd_t *)(puVar12 + 6);
        iVar17 = 1 << ((char)*(int *)(puVar9 + 8) - 6U & 0x1f);
        if (*(int *)(puVar9 + 8) < 7) {
          iVar17 = 1;
        }
        if (*(int *)(puVar12 + 6) < iVar17) {
          if ((void *)puVar12[7] == (void *)0x0) {
            pvVar13 = malloc((long)iVar17 << 3);
          }
          else {
            pvVar13 = realloc((void *)puVar12[7],(long)iVar17 << 3);
          }
          puVar12[7] = pvVar13;
          if (pvVar13 == (void *)0x0) {
            __assert_fail("p->pArray",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecWrd.h"
                          ,0x205,"void Vec_WrdGrow(Vec_Wrd_t *, int)");
          }
          p_00->nCap = iVar17;
        }
        if (0 < p_00->nCap) {
          lVar18 = 0;
          do {
            Vec_WrdPush(p_00,pwVar14[lVar18]);
            lVar18 = lVar18 + 1;
          } while (lVar18 < p_00->nCap);
        }
        for (pMVar11 = Mio_GateReadPins(pGate); pMVar11 != (Mio_Pin_t *)0x0;
            pMVar11 = Mio_PinReadNext(pMVar11)) {
          MVar5 = Mio_PinReadPhase(pMVar11);
          puVar15 = (undefined8 *)calloc(1,0x18);
          uVar1 = *(uint *)(puVar12 + 8);
          if (*(uint *)((long)puVar12 + 0x44) == uVar1) {
            if ((int)uVar1 < 0x10) {
              if ((void *)puVar12[9] == (void *)0x0) {
                pvVar13 = malloc(0x80);
              }
              else {
                pvVar13 = realloc((void *)puVar12[9],0x80);
              }
              iVar17 = 0x10;
            }
            else {
              iVar17 = uVar1 * 2;
              if (iVar17 <= (int)uVar1) goto LAB_00469595;
              if ((void *)puVar12[9] == (void *)0x0) {
                pvVar13 = malloc((ulong)uVar1 << 4);
              }
              else {
                pvVar13 = realloc((void *)puVar12[9],(ulong)uVar1 << 4);
              }
            }
            puVar12[9] = pvVar13;
            *(int *)(puVar12 + 8) = iVar17;
          }
LAB_00469595:
          iVar17 = *(int *)((long)puVar12 + 0x44);
          *(int *)((long)puVar12 + 0x44) = iVar17 + 1;
          *(undefined8 **)(puVar12[9] + (long)iVar17 * 8) = puVar15;
          pcVar6 = Mio_PinReadName(pMVar11);
          if (pcVar6 == (char *)0x0) {
            pcVar8 = (char *)0x0;
          }
          else {
            sVar7 = strlen(pcVar6);
            pcVar8 = (char *)malloc(sVar7 + 1);
            strcpy(pcVar8,pcVar6);
          }
          *puVar15 = pcVar8;
          pvVar13 = calloc(1,0x2d8);
          uVar1 = *(uint *)(puVar15 + 1);
          if (*(uint *)((long)puVar15 + 0xc) == uVar1) {
            if ((int)uVar1 < 0x10) {
              if ((void *)puVar15[2] == (void *)0x0) {
                pvVar16 = malloc(0x80);
              }
              else {
                pvVar16 = realloc((void *)puVar15[2],0x80);
              }
              puVar15[2] = pvVar16;
              iVar17 = 0x10;
            }
            else {
              iVar17 = uVar1 * 2;
              if (iVar17 <= (int)uVar1) goto LAB_0046966e;
              if ((void *)puVar15[2] == (void *)0x0) {
                pvVar16 = malloc((ulong)uVar1 << 4);
              }
              else {
                pvVar16 = realloc((void *)puVar15[2],(ulong)uVar1 << 4);
              }
              puVar15[2] = pvVar16;
            }
            *(int *)(puVar15 + 1) = iVar17;
          }
LAB_0046966e:
          iVar17 = *(int *)((long)puVar15 + 0xc);
          *(int *)((long)puVar15 + 0xc) = iVar17 + 1;
          *(void **)(puVar15[2] + (long)iVar17 * 8) = pvVar13;
          if (MIO_PHASE_NONINV < MVar5) {
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/scl/sclLibScl.c"
                          ,0x9e,"int Abc_SclReadLibraryGenlib(SC_Lib *, Mio_Library_t *)");
          }
          *(Mio_PinPhase_t *)((long)pvVar13 + 8) = 3 - MVar5;
          Abc_SclReadSurfaceGenlib((SC_Surface *)((long)pvVar13 + 0x18));
          Abc_SclReadSurfaceGenlib((SC_Surface *)((long)pvVar13 + 200));
          Abc_SclReadSurfaceGenlib((SC_Surface *)((long)pvVar13 + 0x178));
          Abc_SclReadSurfaceGenlib((SC_Surface *)((long)pvVar13 + 0x228));
        }
        iVar4 = iVar4 + 1;
      } while (iVar4 < *(int *)((long)puVar9 + 0x44));
    }
    pGate = Mio_GateReadNext(pGate);
  } while( true );
}

Assistant:

SC_Lib * Abc_SclReadFromGenlib( void * pLib0 )
{
    Mio_Library_t * pLib = (Mio_Library_t *)pLib0;
    SC_Lib * p = Abc_SclLibAlloc();
    if ( !Abc_SclReadLibraryGenlib( p, pLib ) )
        return NULL;
    // hash gates by name
    Abc_SclHashCells( p );
    Abc_SclLinkCells( p );
    return p;
}